

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

void * __thiscall
ON_FixedSizePoolIterator::NextBlock(ON_FixedSizePoolIterator *this,size_t *block_element_count)

{
  size_t sVar1;
  size_t *block_element_count_local;
  ON_FixedSizePoolIterator *this_local;
  
  if (((this->m_it_block == (void *)0x0) || (this->m_it_block == this->m_fsp->m_al_block)) ||
     (this->m_it_element != (void *)((long)this->m_it_block + 0x10))) {
    this->m_it_block = (void *)0x0;
    this->m_it_element = (void *)0x0;
    if (block_element_count != (size_t *)0x0) {
      *block_element_count = 0;
    }
  }
  else {
    this->m_it_block = *this->m_it_block;
    if (this->m_it_block == this->m_fsp->m_al_element_array) {
      this->m_it_block = (void *)0x0;
      this->m_it_element = (void *)0x0;
      if (block_element_count != (size_t *)0x0) {
        *block_element_count = 0;
      }
    }
    else {
      this->m_it_element = (void *)((long)this->m_it_block + 0x10);
      if (block_element_count != (size_t *)0x0) {
        sVar1 = ON_FixedSizePool::BlockElementCount(this->m_fsp,this->m_it_block);
        *block_element_count = sVar1;
      }
    }
  }
  return this->m_it_element;
}

Assistant:

void* ON_FixedSizePoolIterator::NextBlock( size_t* block_element_count )
{
  if ( 0 != m_it_block
       && m_it_block != m_fsp->m_al_block
       && m_it_element == (void*)(((char*)m_it_block)+2*sizeof(void*)) )
  {
    m_it_block = *((void**)m_it_block);
    if ( m_it_block == m_fsp->m_al_element_array )
    {
      m_it_block = 0;
      m_it_element = 0;
      if ( 0 != block_element_count )
        *block_element_count = 0;
    }
    else
    {
      m_it_element = (void*)(((char*)m_it_block)+2*sizeof(void*)); // m_it_element points to first element in m_first_block
      if ( 0 != block_element_count )
        *block_element_count = m_fsp->BlockElementCount(m_it_block);
    }
  }
  else
  {
    m_it_block = 0;
    m_it_element = 0;
    if ( 0 != block_element_count )
      *block_element_count = 0;
  }
  return m_it_element;
}